

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_string(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
           string_type *buffer,error_code *ec)

{
  size_t sVar1;
  type_conflict tVar2;
  ssize_t sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *this_00;
  size_t in_RCX;
  error_code *in_RDI;
  uint8_t c;
  size_t size;
  type_conflict len;
  size_t n;
  uint8_t buf [4];
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_ffffffffffffffa0;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *pvVar6;
  undefined8 in_stack_ffffffffffffffa8;
  bson_errc bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint8_t local_1c [28];
  
  bVar8 = (bson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  sVar3 = stream_source<unsigned_char>::read
                    ((stream_source<unsigned_char> *)(in_RDI + 1),(int)local_1c,(void *)0x4,in_RCX);
  pvVar4 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
           back(in_stack_ffffffffffffffa0);
  pvVar4->pos = sVar3 + pvVar4->pos;
  if (sVar3 == 4) {
    tVar2 = binary::little_to_native<int,jsoncons::detail::endian>(local_1c,4);
    if (tVar2 < 1) {
      std::error_code::operator=(in_RDI,bVar8);
      *(undefined1 *)&in_RDI->_M_cat = 0;
    }
    else {
      v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)tVar2 + -1);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               source_reader<jsoncons::stream_source<unsigned_char>>::read<std::__cxx11::string>
                         ((stream_source<unsigned_char> *)CONCAT44(tVar2,in_stack_ffffffffffffffd0),
                          v,in_stack_ffffffffffffffc0);
      pbVar7 = pbVar5;
      pvVar4 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_ffffffffffffffa0);
      sVar1 = pvVar4->pos;
      pvVar4->pos = (size_t)(&pbVar7->_M_dataplus + sVar1);
      if (pbVar5 == v) {
        this_00 = (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                   *)stream_source<unsigned_char>::read
                               ((stream_source<unsigned_char> *)(in_RDI + 1),
                                (int)&stack0xffffffffffffffc7,(void *)0x1,
                                (size_t)(&pbVar7->_M_dataplus + sVar1));
        bVar8 = (bson_errc)((ulong)pbVar7 >> 0x20);
        pvVar6 = this_00;
        pvVar4 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(this_00);
        pvVar4->pos = (long)&(pvVar6->
                             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                             )._M_impl.super__Vector_impl_data._M_start + pvVar4->pos;
        if (this_00 !=
            (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)0x1
           ) {
          std::error_code::operator=(in_RDI,bVar8);
          *(undefined1 *)&in_RDI->_M_cat = 0;
        }
      }
      else {
        std::error_code::operator=(in_RDI,(bson_errc)((ulong)pbVar7 >> 0x20));
        *(undefined1 *)&in_RDI->_M_cat = 0;
      }
    }
  }
  else {
    std::error_code::operator=(in_RDI,bVar8);
    *(undefined1 *)&in_RDI->_M_cat = 0;
  }
  return;
}

Assistant:

void read_string(string_type& buffer, std::error_code& ec)
    {
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
        if (JSONCONS_UNLIKELY(len < 1))
        {
            ec = bson_errc::string_length_is_non_positive;
            more_ = false;
            return;
        }

        std::size_t size = static_cast<std::size_t>(len) - static_cast<std::size_t>(1);
        n = source_reader<Source>::read(source_, buffer, size);
        state_stack_.back().pos += n;

        if (JSONCONS_UNLIKELY(n != size))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        uint8_t c;
        n = source_.read(&c, 1);
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != 1))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
    }